

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlankingSector.cpp
# Opt level: O1

int __thiscall DIS::BlankingSector::getMarshalledSize(BlankingSector *this)

{
  return 0x1d;
}

Assistant:

int BlankingSector::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordType
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 1;  // _emitterNumber
   marshalSize = marshalSize + 1;  // _beamNumber
   marshalSize = marshalSize + 1;  // _stateIndicator
   marshalSize = marshalSize + 4;  // _leftAzimuth
   marshalSize = marshalSize + 4;  // _rightAzimuth
   marshalSize = marshalSize + 4;  // _lowerElevation
   marshalSize = marshalSize + 4;  // _upperElevation
   marshalSize = marshalSize + 4;  // _residualPower
    return marshalSize;
}